

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

BBox * __thiscall CGL::GLScene::Scene::get_bbox(BBox *__return_storage_ptr__,Scene *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  BBox BStack_88;
  
  (__return_storage_ptr__->max).field_0.field_0.x = -INFINITY;
  (__return_storage_ptr__->max).field_0.field_0.y = -INFINITY;
  (__return_storage_ptr__->max).field_0.field_0.z = -INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.x = INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.y = INFINITY;
  (__return_storage_ptr__->min).field_0.field_0.z = INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.x = -INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.y = -INFINITY;
  (__return_storage_ptr__->extent).field_0.field_0.z = -INFINITY;
  ppSVar1 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->objects).
                 super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar2 != ppSVar1;
      ppSVar2 = ppSVar2 + 1) {
    (*(*ppSVar2)->_vptr_SceneObject[3])(&BStack_88);
    BBox::expand(__return_storage_ptr__,&BStack_88);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Scene::get_bbox() {
  BBox bbox;
  for (SceneObject *obj : objects) {
    bbox.expand(obj->get_bbox());
  }
  return bbox;
}